

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::CharSet<char16_t>::IsEqualTo(CharSet<char16_t> *this,CharSet<char16_t> *other)

{
  undefined1 *puVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  CharSetNode *pCVar5;
  size_t sVar6;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  undefined4 *puVar13;
  ulong uVar14;
  CharSetNode *pCVar15;
  uint index;
  undefined1 auVar16 [16];
  
  pCVar15 = (this->rep).full.root;
  pCVar5 = (CharSetNode *)(other->rep).compact.countPlusOne;
  puVar1 = (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7);
  if ((undefined1 *)((long)&pCVar15[-1]._vptr_CharSetNode + 7U) < (undefined1 *)0x5) {
    index = 0;
    bVar8 = false;
    if (pCVar15 == pCVar5 && puVar1 < (undefined1 *)0x5) {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      while( true ) {
        if ((undefined1 *)0x4 < (undefined1 *)((long)&pCVar15[-1]._vptr_CharSetNode + 7U)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x1ef,"(IsCompact())","IsCompact()");
          if (!bVar8) {
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
          *puVar13 = 0;
          pCVar15 = (CharSetNode *)(this->rep).compact.countPlusOne;
        }
        bVar8 = (int)pCVar15 - 1U <= index;
        if (bVar8) break;
        uVar10 = GetCompactCharU(this,index);
        sVar6 = (other->rep).compact.countPlusOne;
        if (sVar6 - 1 < 5) {
          uVar11 = uVar10 & 0xffff;
          auVar16._0_4_ = -(uint)(uVar11 == (other->rep).compact.cs[0]);
          auVar16._4_4_ = -(uint)(uVar11 == (other->rep).compact.cs[1]);
          auVar16._8_4_ = -(uint)(uVar11 == (other->rep).compact.cs[2]);
          auVar16._12_4_ = -(uint)(uVar11 == (other->rep).compact.cs[3]);
          uVar11 = movmskps(uVar11,auVar16);
joined_r0x00e5cc0c:
          if (uVar11 == 0) {
            return bVar8;
          }
        }
        else {
          if ((uVar10 & 0xff00) == 0) {
            uVar11 = *(uint *)((long)&other->rep + (ulong)((uVar10 & 0xffff) >> 5) * 4 + 8) >>
                     (uVar10 & 0x1f) & 1;
            goto joined_r0x00e5cc0c;
          }
          if (sVar6 == 0) {
            return bVar8;
          }
          bVar9 = Get_helper(other,uVar10 & 0xffff);
          if (!bVar9) {
            return bVar8;
          }
        }
        index = index + 1;
        pCVar15 = (CharSetNode *)(this->rep).compact.countPlusOne;
      }
    }
  }
  else {
    if (((undefined1 *)0x4 < puVar1) && ((this->rep).compact.cs[0] == (other->rep).compact.cs[0])) {
      uVar14 = 0xffffffffffffffff;
      do {
        if (uVar14 == 6) goto LAB_00e5cc4d;
        lVar3 = uVar14 * 4;
        uVar2 = uVar14 + 1;
        lVar4 = uVar14 * 4;
        uVar14 = uVar2;
      } while (*(int *)((long)&this->rep + lVar3 + 0x10) ==
               *(int *)((long)&other->rep + lVar4 + 0x10));
      if (6 < uVar2) {
LAB_00e5cc4d:
        if (pCVar15 == (CharSetNode *)0x0 || pCVar5 == (CharSetNode *)0x0) {
          return (pCVar15 == (CharSetNode *)0x0) == (pCVar5 == (CharSetNode *)0x0);
        }
        iVar12 = (*pCVar15->_vptr_CharSetNode[10])(pCVar15,2);
        return SUB41(iVar12,0);
      }
    }
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool CharSet<char16>::IsEqualTo(const CharSet<Char>& other) const
    {
        if (IsCompact())
        {
            if (!other.IsCompact())
                return false;
            if (rep.compact.countPlusOne != other.rep.compact.countPlusOne)
                return false;
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                if (!other.Get(this->GetCompactChar(i)))
                    return false;
            }
            return true;
        }
        else
        {
            if (other.IsCompact())
                return false;
            if (!rep.full.direct.IsEqualTo(other.rep.full.direct))
                return false;
            if ((rep.full.root == nullptr) != (other.rep.full.root == nullptr))
                return false;
            if (rep.full.root == nullptr)
                return true;
            return rep.full.root->IsEqualTo(CharSetNode::levels - 1, other.rep.full.root);
        }
    }